

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O2

QByteArray * __thiscall
QHttpNetworkReply::readAll(QByteArray *__return_storage_ptr__,QHttpNetworkReply *this)

{
  QByteDataBuffer::readAll(__return_storage_ptr__,(QByteDataBuffer *)(*(long *)(this + 8) + 400));
  return __return_storage_ptr__;
}

Assistant:

QByteArray QHttpNetworkReply::readAll()
{
    Q_D(QHttpNetworkReply);
    return d->responseData.readAll();
}